

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

bool __thiscall
Chainstate::ConnectTip
          (Chainstate *this,BlockValidationState *state,CBlockIndex *pindexNew,
          shared_ptr<const_CBlock> *pblock,ConnectTrace *connectTrace,
          DisconnectedBlockTransactions *disconnectpool)

{
  duration *pdVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  uchar *puVar2;
  pointer ppCVar3;
  Notifications *pNVar4;
  ValidationSignals *this_01;
  ChainstateManager *pCVar5;
  uint256 *puVar6;
  double dVar7;
  string_view source_file;
  base_blob<256U> *pbVar8;
  element_type *block;
  bool bVar9;
  bool bVar10;
  long lVar11;
  Logger *pLVar12;
  long lVar13;
  CCoinsViewCache *baseIn;
  long lVar14;
  Chainstate *pCVar15;
  CBlockIndex *pCVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar17;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  shared_ptr<const_CBlock> pblock_00;
  string_view str;
  string_view logging_function_06;
  char *pcVar18;
  double *pdVar19;
  double *in_stack_fffffffffffffc98;
  element_type *local_338;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_330;
  shared_ptr<const_CBlock> pthisBlock;
  string local_308;
  pointer local_2e8;
  pointer psStack_2e0;
  pointer local_2d8;
  undefined8 uStack_2d0;
  string local_2c0;
  CCoinsViewCache view;
  double local_98 [4];
  string local_78;
  shared_ptr<CBlock> pblockNew;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ppCVar3 = (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppCVar3 ==
      (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pCVar16 = (CBlockIndex *)0x0;
  }
  else {
    pCVar16 = ppCVar3[-1];
  }
  if (pindexNew->pprev != pCVar16) {
    __assert_fail("pindexNew->pprev == m_chain.Tip()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                  ,0xc47,
                  "bool Chainstate::ConnectTip(BlockValidationState &, CBlockIndex *, const std::shared_ptr<const CBlock> &, ConnectTrace &, DisconnectedBlockTransactions &)"
                 );
  }
  lVar11 = std::chrono::_V2::steady_clock::now();
  pthisBlock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  pthisBlock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((pblock->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    this_00 = &pblockNew.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    pblockNew.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<CBlock,std::allocator<CBlock>>
              (this_00,(CBlock **)&pblockNew,(allocator<CBlock> *)&view);
    bVar9 = ::node::BlockManager::ReadBlockFromDisk
                      (this->m_blockman,
                       pblockNew.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       pindexNew);
    if (bVar9) {
      pthisBlock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           pblockNew.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&pthisBlock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,this_00);
    }
    else {
      pNVar4 = (this->m_chainman->m_options).notifications;
      view.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView =
           (_func_int **)&view.m_deterministic;
      std::__cxx11::string::_M_construct<char_const*>((string *)&view,"Failed to read block.","");
      pbVar17 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (view.hashBlock.super_base_blob<256U>.m_data._M_elems + 0xf);
      puVar2 = view.hashBlock.super_base_blob<256U>.m_data._M_elems + 0x1f;
      if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
        view.hashBlock.super_base_blob<256U>.m_data._M_elems._15_8_ = puVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)pbVar17,"Failed to read block.","");
      }
      else {
        local_78._M_dataplus._M_p = "Failed to read block.";
        (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                  (pbVar17,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&local_78);
      }
      (*pNVar4->_vptr_Notifications[8])(pNVar4,&view);
      if ((state->super_ValidationState<BlockValidationResult>).m_mode == M_VALID) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&(state->super_ValidationState<BlockValidationResult>).m_reject_reason,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&view);
      }
      (state->super_ValidationState<BlockValidationResult>).m_mode = M_ERROR;
      if ((uchar *)view.hashBlock.super_base_blob<256U>.m_data._M_elems._15_8_ != puVar2) {
        operator_delete((void *)view.hashBlock.super_base_blob<256U>.m_data._M_elems._15_8_,
                        view._48_8_ + 1);
      }
      if (view.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView !=
          (_func_int **)&view.m_deterministic) {
        operator_delete(view.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView,
                        view._16_8_ + 1);
      }
    }
    if (pblockNew.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (pblockNew.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ;
    }
    if (bVar9) goto LAB_00409e37;
  }
  else {
    pLVar12 = LogInstance();
    bVar9 = BCLog::Logger::WillLogCategoryLevel(pLVar12,BENCH,Debug);
    if (bVar9) {
      logging_function._M_str = "ConnectTip";
      logging_function._M_len = 10;
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
      ;
      source_file_00._M_len = 0x57;
      ::LogPrintf_<>(logging_function,source_file_00,0xc52,BENCH,Debug,"  - Using cached block\n");
    }
    pthisBlock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (pblock->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&pthisBlock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &(pblock->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
LAB_00409e37:
    block = pthisBlock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    lVar13 = std::chrono::_V2::steady_clock::now();
    pLVar12 = LogInstance();
    pcVar18 = (char *)0x409e5b;
    bVar9 = BCLog::Logger::WillLogCategoryLevel(pLVar12,BENCH,Debug);
    if (bVar9) {
      view.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView =
           (_func_int **)((double)(lVar13 - lVar11) / 1000000.0);
      logging_function_00._M_str = "ConnectTip";
      logging_function_00._M_len = 10;
      source_file_01._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
      ;
      source_file_01._M_len = 0x57;
      LogPrintf_<double>(logging_function_00,source_file_01,0xc5c,
                         IPC|COINDB|PROXY|RAND|CMPCTBLOCK|REINDEX|ESTIMATEFEE,(Level)&view,pcVar18,
                         in_stack_fffffffffffffc98);
    }
    baseIn = CoinsTip(this);
    CCoinsViewCache::CCoinsViewCache(&view,(CCoinsView *)baseIn,false);
    pbVar17 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    bVar9 = ConnectBlock(this,block,state,pindexNew,&view,false);
    this_01 = (this->m_chainman->m_options).signals;
    if (this_01 != (ValidationSignals *)0x0) {
      ValidationSignals::BlockChecked(this_01,block,state);
    }
    if (bVar9) {
      lVar14 = std::chrono::_V2::steady_clock::now();
      pCVar5 = this->m_chainman;
      pdVar1 = &pCVar5->time_connect_total;
      pdVar1->__r = pdVar1->__r + (lVar14 - lVar13);
      if (pCVar5->num_blocks_total < 1) {
        __assert_fail("m_chainman.num_blocks_total > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                      ,0xc6b,
                      "bool Chainstate::ConnectTip(BlockValidationState &, CBlockIndex *, const std::shared_ptr<const CBlock> &, ConnectTrace &, DisconnectedBlockTransactions &)"
                     );
      }
      pLVar12 = LogInstance();
      pdVar19 = (double *)0x409f58;
      bVar10 = BCLog::Logger::WillLogCategoryLevel(pLVar12,BENCH,Debug);
      if (bVar10) {
        pblockNew.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)((double)(lVar14 - lVar13) / 1000000.0);
        dVar7 = (double)(this->m_chainman->time_connect_total).__r;
        local_78._M_dataplus._M_p = (pointer)(dVar7 / 1000000000.0);
        local_98[0] = (dVar7 / 1000000.0) / (double)this->m_chainman->num_blocks_total;
        logging_function_01._M_str = "ConnectTip";
        logging_function_01._M_len = 10;
        source_file_02._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
        ;
        source_file_02._M_len = 0x57;
        LogPrintf_<double,double,double>
                  (logging_function_01,source_file_02,0xc6f,
                   IPC|COINDB|PROXY|RAND|CMPCTBLOCK|REINDEX|ESTIMATEFEE|WALLETDB|ZMQ|TOR,
                   (Level)&pblockNew,(char *)&local_78,local_98,pdVar19,in_stack_fffffffffffffc98);
      }
      bVar10 = CCoinsViewCache::Flush(&view);
      if (!bVar10) {
        __assert_fail("flushed",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                      ,0xc71,
                      "bool Chainstate::ConnectTip(BlockValidationState &, CBlockIndex *, const std::shared_ptr<const CBlock> &, ConnectTrace &, DisconnectedBlockTransactions &)"
                     );
      }
    }
    else {
      if ((state->super_ValidationState<BlockValidationResult>).m_mode == M_INVALID) {
        InvalidBlockFound(this,pindexNew,state);
      }
      puVar6 = pindexNew->phashBlock;
      if (puVar6 == (uint256 *)0x0) {
        __assert_fail("phashBlock != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h"
                      ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
      }
      local_2e8 = *(pointer *)(puVar6->super_base_blob<256U>).m_data._M_elems;
      psStack_2e0 = *(pointer *)((puVar6->super_base_blob<256U>).m_data._M_elems + 8);
      local_2d8 = *(pointer *)((puVar6->super_base_blob<256U>).m_data._M_elems + 0x10);
      pbVar8 = &puVar6->super_base_blob<256U>;
      uStack_2d0._0_1_ = (bool)(pbVar8->m_data)._M_elems[0x18];
      uStack_2d0._1_1_ = (bool)(pbVar8->m_data)._M_elems[0x19];
      uStack_2d0._2_1_ = (bool)(pbVar8->m_data)._M_elems[0x1a];
      uStack_2d0._3_1_ = (pbVar8->m_data)._M_elems[0x1b];
      uStack_2d0._4_1_ = (pbVar8->m_data)._M_elems[0x1c];
      uStack_2d0._5_1_ = (pbVar8->m_data)._M_elems[0x1d];
      uStack_2d0._6_1_ = (pbVar8->m_data)._M_elems[0x1e];
      uStack_2d0._7_1_ = (pbVar8->m_data)._M_elems[0x1f];
      base_blob<256u>::ToString_abi_cxx11_(&local_2c0,&local_2e8);
      ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                (&local_308,&state->super_ValidationState<BlockValidationResult>);
      pLVar12 = LogInstance();
      bVar10 = BCLog::Logger::Enabled(pLVar12);
      if (bVar10) {
        pblockNew.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_48._M_local_buf[0] = '\0';
        pblockNew.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&local_48;
        tinyformat::format<char[11],std::__cxx11::string,std::__cxx11::string>
                  (&local_78,(tinyformat *)"%s: ConnectBlock %s failed, %s\n","ConnectTip",
                   (char (*) [11])&local_2c0,&local_308,pbVar17);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pblockNew,
                   &local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        pLVar12 = LogInstance();
        local_78._M_dataplus._M_p = (char *)0x57;
        local_78._M_string_length = 0x84a7d9;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
        ;
        source_file._M_len = 0x57;
        str._M_str = (char *)pblockNew.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        str._M_len = (size_t)pblockNew.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi;
        logging_function_06._M_str = "ConnectTip";
        logging_function_06._M_len = 10;
        BCLog::Logger::LogPrintStr(pLVar12,str,logging_function_06,source_file,0xc66,ALL,Error);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pblockNew.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr != &local_48)
        {
          operator_delete(pblockNew.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          CONCAT71(local_48._M_allocated_capacity._1_7_,local_48._M_local_buf[0]) +
                          1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != &local_308.field_2) {
        operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
      }
      lVar14 = 0;
    }
    view.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView =
         (_func_int **)&PTR_GetCoin_00b3f380;
    std::
    _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&view.cacheCoins._M_h);
    if (view.m_sentinel.second.m_flags != '\0') {
      ((view.m_sentinel.second.m_next)->second).m_prev = view.m_sentinel.second.m_prev;
      ((view.m_sentinel.second.m_prev)->second).m_next = view.m_sentinel.second.m_next;
      view.m_sentinel.second.m_flags = '\0';
    }
    if (0x1c < view.m_sentinel.second.coin.out.scriptPubKey.super_CScriptBase._size) {
      free(view.m_sentinel.second.coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.
           indirect);
      view.m_sentinel.second.coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.
      indirect = (char *)0x0;
    }
    PoolResource<144UL,_8UL>::~PoolResource(&view.m_cache_coins_memory_resource);
    if (bVar9) {
      lVar13 = std::chrono::_V2::steady_clock::now();
      pdVar1 = &this->m_chainman->time_flush;
      pdVar1->__r = pdVar1->__r + (lVar13 - lVar14);
      pLVar12 = LogInstance();
      pdVar19 = (double *)0x40a19a;
      bVar9 = BCLog::Logger::WillLogCategoryLevel(pLVar12,BENCH,Debug);
      if (bVar9) {
        view.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView =
             (_func_int **)((double)(lVar13 - lVar14) / 1000000.0);
        dVar7 = (double)(this->m_chainman->time_flush).__r;
        pblockNew.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)(dVar7 / 1000000000.0);
        local_78._M_dataplus._M_p =
             (pointer)((dVar7 / 1000000.0) / (double)this->m_chainman->num_blocks_total);
        logging_function_02._M_str = "ConnectTip";
        logging_function_02._M_len = 10;
        source_file_03._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
        ;
        source_file_03._M_len = 0x57;
        LogPrintf_<double,double,double>
                  (logging_function_02,source_file_03,0xc78,
                   IPC|COINDB|PROXY|RAND|CMPCTBLOCK|REINDEX|ESTIMATEFEE|RPC|BENCH|TOR,(Level)&view,
                   (char *)&pblockNew,(double *)&local_78,pdVar19,in_stack_fffffffffffffc98);
      }
      pcVar18 = (char *)0x0;
      bVar9 = FlushStateToDisk(this,state,IF_NEEDED,0);
      if (bVar9) {
        lVar14 = std::chrono::_V2::steady_clock::now();
        pdVar1 = &this->m_chainman->time_chainstate;
        pdVar1->__r = pdVar1->__r + (lVar14 - lVar13);
        pLVar12 = LogInstance();
        pdVar19 = (double *)0x40a292;
        bVar10 = BCLog::Logger::WillLogCategoryLevel(pLVar12,BENCH,Debug);
        if (bVar10) {
          view.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView =
               (_func_int **)((double)(lVar14 - lVar13) / 1000000.0);
          dVar7 = (double)(this->m_chainman->time_chainstate).__r;
          pblockNew.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)(dVar7 / 1000000000.0);
          local_78._M_dataplus._M_p =
               (pointer)((dVar7 / 1000000.0) / (double)this->m_chainman->num_blocks_total);
          logging_function_03._M_str = "ConnectTip";
          logging_function_03._M_len = 10;
          source_file_04._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
          ;
          source_file_04._M_len = 0x57;
          pcVar18 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp";
          LogPrintf_<double,double,double>
                    (logging_function_03,source_file_04,0xc82,
                     IPC|COINDB|PROXY|RAND|CMPCTBLOCK|REINDEX|ESTIMATEFEE|RPC|ZMQ|BENCH|HTTP|TOR,
                     (Level)&view,(char *)&pblockNew,(double *)&local_78,pdVar19,
                     in_stack_fffffffffffffc98);
        }
        if (this->m_mempool != (CTxMemPool *)0x0) {
          CTxMemPool::removeForBlock(this->m_mempool,&block->vtx,pindexNew->nHeight);
          DisconnectedBlockTransactions::removeForBlock(disconnectpool,&block->vtx);
        }
        CChain::SetTip(&this->m_chain,pindexNew);
        UpdateTip(this,pindexNew);
        lVar13 = std::chrono::_V2::steady_clock::now();
        pCVar5 = this->m_chainman;
        pdVar1 = &pCVar5->time_post_connect;
        pdVar1->__r = pdVar1->__r + (lVar13 - lVar14);
        pdVar1 = &pCVar5->time_total;
        pdVar1->__r = pdVar1->__r + (lVar13 - lVar11);
        pLVar12 = LogInstance();
        pdVar19 = (double *)0x40a3c4;
        bVar10 = BCLog::Logger::WillLogCategoryLevel(pLVar12,BENCH,Debug);
        if (bVar10) {
          view.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView =
               (_func_int **)((double)(lVar13 - lVar14) / 1000000.0);
          dVar7 = (double)(this->m_chainman->time_post_connect).__r;
          pblockNew.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)(dVar7 / 1000000000.0);
          local_78._M_dataplus._M_p =
               (pointer)((dVar7 / 1000000.0) / (double)this->m_chainman->num_blocks_total);
          logging_function_04._M_str = "ConnectTip";
          logging_function_04._M_len = 10;
          source_file_05._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
          ;
          source_file_05._M_len = 0x57;
          pcVar18 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp";
          LogPrintf_<double,double,double>
                    (logging_function_04,source_file_05,0xc92,
                     IPC|COINDB|PROXY|RAND|CMPCTBLOCK|REINDEX|ESTIMATEFEE|RPC|WALLETDB|ZMQ|HTTP|
                     MEMPOOL|TOR|NET,(Level)&view,(char *)&pblockNew,(double *)&local_78,pdVar19,
                     in_stack_fffffffffffffc98);
        }
        pLVar12 = LogInstance();
        pdVar19 = (double *)0x40a487;
        bVar10 = BCLog::Logger::WillLogCategoryLevel(pLVar12,BENCH,Debug);
        if (bVar10) {
          view.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView =
               (_func_int **)((double)(lVar13 - lVar11) / 1000000.0);
          dVar7 = (double)(this->m_chainman->time_total).__r;
          pblockNew.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)(dVar7 / 1000000000.0);
          local_78._M_dataplus._M_p =
               (pointer)((dVar7 / 1000000.0) / (double)this->m_chainman->num_blocks_total);
          logging_function_05._M_str = "ConnectTip";
          logging_function_05._M_len = 10;
          source_file_06._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
          ;
          source_file_06._M_len = 0x57;
          pcVar18 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp";
          LogPrintf_<double,double,double>
                    (logging_function_05,source_file_06,0xc96,
                     IPC|COINDB|PROXY|RAND|CMPCTBLOCK|REINDEX|ADDRMAN|ZMQ|MEMPOOL|NET,(Level)&view,
                     (char *)&pblockNew,(double *)&local_78,pdVar19,in_stack_fffffffffffffc98);
        }
        pCVar15 = ChainstateManager::ActiveChainstate(this->m_chainman);
        if (pCVar15 != this) {
          ChainstateManager::MaybeCompleteSnapshotValidation(this->m_chainman);
        }
        local_338 = pthisBlock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Stack_330 = pthisBlock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        pthisBlock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        pthisBlock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        pblock_00.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pcVar18;
        pblock_00.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&local_338;
        ConnectTrace::BlockConnected(connectTrace,pindexNew,pblock_00);
        if (p_Stack_330 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_330);
        }
      }
      goto LAB_0040a585;
    }
  }
  bVar9 = false;
LAB_0040a585:
  if (pthisBlock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (pthisBlock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar9;
  }
  __stack_chk_fail();
}

Assistant:

bool Chainstate::ConnectTip(BlockValidationState& state, CBlockIndex* pindexNew, const std::shared_ptr<const CBlock>& pblock, ConnectTrace& connectTrace, DisconnectedBlockTransactions& disconnectpool)
{
    AssertLockHeld(cs_main);
    if (m_mempool) AssertLockHeld(m_mempool->cs);

    assert(pindexNew->pprev == m_chain.Tip());
    // Read block from disk.
    const auto time_1{SteadyClock::now()};
    std::shared_ptr<const CBlock> pthisBlock;
    if (!pblock) {
        std::shared_ptr<CBlock> pblockNew = std::make_shared<CBlock>();
        if (!m_blockman.ReadBlockFromDisk(*pblockNew, *pindexNew)) {
            return FatalError(m_chainman.GetNotifications(), state, _("Failed to read block."));
        }
        pthisBlock = pblockNew;
    } else {
        LogDebug(BCLog::BENCH, "  - Using cached block\n");
        pthisBlock = pblock;
    }
    const CBlock& blockConnecting = *pthisBlock;
    // Apply the block atomically to the chain state.
    const auto time_2{SteadyClock::now()};
    SteadyClock::time_point time_3;
    // When adding aggregate statistics in the future, keep in mind that
    // num_blocks_total may be zero until the ConnectBlock() call below.
    LogDebug(BCLog::BENCH, "  - Load block from disk: %.2fms\n",
             Ticks<MillisecondsDouble>(time_2 - time_1));
    {
        CCoinsViewCache view(&CoinsTip());
        bool rv = ConnectBlock(blockConnecting, state, pindexNew, view);
        if (m_chainman.m_options.signals) {
            m_chainman.m_options.signals->BlockChecked(blockConnecting, state);
        }
        if (!rv) {
            if (state.IsInvalid())
                InvalidBlockFound(pindexNew, state);
            LogError("%s: ConnectBlock %s failed, %s\n", __func__, pindexNew->GetBlockHash().ToString(), state.ToString());
            return false;
        }
        time_3 = SteadyClock::now();
        m_chainman.time_connect_total += time_3 - time_2;
        assert(m_chainman.num_blocks_total > 0);
        LogDebug(BCLog::BENCH, "  - Connect total: %.2fms [%.2fs (%.2fms/blk)]\n",
                 Ticks<MillisecondsDouble>(time_3 - time_2),
                 Ticks<SecondsDouble>(m_chainman.time_connect_total),
                 Ticks<MillisecondsDouble>(m_chainman.time_connect_total) / m_chainman.num_blocks_total);
        bool flushed = view.Flush();
        assert(flushed);
    }
    const auto time_4{SteadyClock::now()};
    m_chainman.time_flush += time_4 - time_3;
    LogDebug(BCLog::BENCH, "  - Flush: %.2fms [%.2fs (%.2fms/blk)]\n",
             Ticks<MillisecondsDouble>(time_4 - time_3),
             Ticks<SecondsDouble>(m_chainman.time_flush),
             Ticks<MillisecondsDouble>(m_chainman.time_flush) / m_chainman.num_blocks_total);
    // Write the chain state to disk, if necessary.
    if (!FlushStateToDisk(state, FlushStateMode::IF_NEEDED)) {
        return false;
    }
    const auto time_5{SteadyClock::now()};
    m_chainman.time_chainstate += time_5 - time_4;
    LogDebug(BCLog::BENCH, "  - Writing chainstate: %.2fms [%.2fs (%.2fms/blk)]\n",
             Ticks<MillisecondsDouble>(time_5 - time_4),
             Ticks<SecondsDouble>(m_chainman.time_chainstate),
             Ticks<MillisecondsDouble>(m_chainman.time_chainstate) / m_chainman.num_blocks_total);
    // Remove conflicting transactions from the mempool.;
    if (m_mempool) {
        m_mempool->removeForBlock(blockConnecting.vtx, pindexNew->nHeight);
        disconnectpool.removeForBlock(blockConnecting.vtx);
    }
    // Update m_chain & related variables.
    m_chain.SetTip(*pindexNew);
    UpdateTip(pindexNew);

    const auto time_6{SteadyClock::now()};
    m_chainman.time_post_connect += time_6 - time_5;
    m_chainman.time_total += time_6 - time_1;
    LogDebug(BCLog::BENCH, "  - Connect postprocess: %.2fms [%.2fs (%.2fms/blk)]\n",
             Ticks<MillisecondsDouble>(time_6 - time_5),
             Ticks<SecondsDouble>(m_chainman.time_post_connect),
             Ticks<MillisecondsDouble>(m_chainman.time_post_connect) / m_chainman.num_blocks_total);
    LogDebug(BCLog::BENCH, "- Connect block: %.2fms [%.2fs (%.2fms/blk)]\n",
             Ticks<MillisecondsDouble>(time_6 - time_1),
             Ticks<SecondsDouble>(m_chainman.time_total),
             Ticks<MillisecondsDouble>(m_chainman.time_total) / m_chainman.num_blocks_total);

    // If we are the background validation chainstate, check to see if we are done
    // validating the snapshot (i.e. our tip has reached the snapshot's base block).
    if (this != &m_chainman.ActiveChainstate()) {
        // This call may set `m_disabled`, which is referenced immediately afterwards in
        // ActivateBestChain, so that we stop connecting blocks past the snapshot base.
        m_chainman.MaybeCompleteSnapshotValidation();
    }

    connectTrace.BlockConnected(pindexNew, std::move(pthisBlock));
    return true;
}